

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

iterator * __thiscall cppcms::form::iterator::operator=(iterator *this,iterator *other)

{
  if (this != other) {
    std::deque<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)this,
               (deque<unsigned_int,_std::allocator<unsigned_int>_> *)other);
    this->current_ = other->current_;
    this->offset_ = other->offset_;
    booster::copy_ptr<cppcms::form::iterator::_data>::operator=(&this->d,&other->d);
  }
  return this;
}

Assistant:

form::iterator const &form::iterator::operator=(form::iterator const &other)
{
	if(this != &other) {
		return_positions_ = other.return_positions_;
		current_ = other.current_;
		offset_=other.offset_;
		d=other.d;
	}
	return *this;
}